

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  Decomposer local_c1;
  ExprLhs<const_char_*&> local_c0;
  enable_if_t<Detail::conjunction<Detail::negation<Detail::is_ne_comparable<const_char_*&,_int>_>,_Detail::is_eq_0_comparable<const_char_*&>,_Detail::disjunction<std::is_same<int,_int>,_std::is_same<int,_long>_>_>::value,_BinaryExpr<const_char_*&,_int>_>
  local_b8;
  StringRef local_88;
  SourceLineInfo local_78;
  StringRef local_68;
  undefined1 local_58 [8];
  AssertionHandler catchAssertionHandler;
  char *trompeloeil_mock_calls_done_correctly_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)trompeloeil_mock_calls_done_correctly;
  local_68 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/build_O0/_deps/trompeloeil-src/include/catch2/trompeloeil.hpp"
             ,0x42);
  local_88 = operator____catch_sr("trompeloeil_mock_calls_done_correctly != 0",0x2a);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_58,local_68,&local_78,local_88,Normal);
  local_c0 = Catch::operator<=<const_char_*&,_0>
                       (&local_c1,(char **)&catchAssertionHandler.m_resultCapture);
  Catch::operator!=(&local_b8,&local_c0,0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_58,&local_b8.super_ITransientExpression);
  Catch::BinaryExpr<const_char_*&,_int>::~BinaryExpr(&local_b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_58);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_58);
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
#ifdef CATCH_CONFIG_PREFIX_ALL
      CATCH_REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#else
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
#endif
  }